

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

bool __thiscall
slang::ast::detail::ClassSpecializationKey::operator==
          (ClassSpecializationKey *this,ClassSpecializationKey *other)

{
  ConstantValue *lhs;
  ConstantValue *rhs;
  Type *this_00;
  Type *rhs_00;
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  pointer ppTVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  pointer ppTVar7;
  pointer ppCVar8;
  pointer ppTVar9;
  
  if (((this->savedHash == other->savedHash) &&
      (sVar3 = (this->paramValues)._M_extent._M_extent_value,
      sVar3 == (other->paramValues)._M_extent._M_extent_value)) &&
     ((this->typeParams)._M_extent._M_extent_value == (other->typeParams)._M_extent._M_extent_value)
     ) {
    ppCVar8 = (other->paramValues)._M_ptr;
    ppCVar5 = (this->paramValues)._M_ptr;
    for (ppCVar6 = ppCVar5; ppCVar6 != ppCVar5 + sVar3; ppCVar6 = ppCVar6 + 1) {
      lhs = *ppCVar6;
      rhs = *ppCVar8;
      if (rhs == (ConstantValue *)0x0 || lhs == (ConstantValue *)0x0) {
        if (lhs != rhs) goto LAB_002156a2;
      }
      else {
        bVar1 = slang::operator==(lhs,rhs);
        if (!bVar1) goto LAB_002156a2;
        ppCVar5 = (this->paramValues)._M_ptr;
        sVar3 = (this->paramValues)._M_extent._M_extent_value;
      }
      ppCVar8 = ppCVar8 + 1;
    }
    ppTVar7 = (other->typeParams)._M_ptr;
    ppTVar4 = (this->typeParams)._M_ptr;
    for (ppTVar9 = ppTVar4;
        bVar1 = ppTVar9 == ppTVar4 + (this->typeParams)._M_extent._M_extent_value, !bVar1;
        ppTVar9 = ppTVar9 + 1) {
      this_00 = *ppTVar9;
      rhs_00 = *ppTVar7;
      if (rhs_00 == (Type *)0x0 || this_00 == (Type *)0x0) {
        if (this_00 != rhs_00) {
          return bVar1;
        }
      }
      else {
        bVar2 = Type::isMatching(this_00,rhs_00);
        if (!bVar2) {
          return bVar1;
        }
        ppTVar4 = (this->typeParams)._M_ptr;
      }
      ppTVar7 = ppTVar7 + 1;
    }
  }
  else {
LAB_002156a2:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ClassSpecializationKey::operator==(const ClassSpecializationKey& other) const {
    if (savedHash != other.savedHash || paramValues.size() != other.paramValues.size() ||
        typeParams.size() != other.typeParams.size()) {
        return false;
    }

    for (auto lit = paramValues.begin(), rit = other.paramValues.begin(); lit != paramValues.end();
         lit++, rit++) {
        const ConstantValue* l = *lit;
        const ConstantValue* r = *rit;
        if (l && r) {
            if (!(*l == *r))
                return false;
        }
        else {
            if (l != r)
                return false;
        }
    }

    for (auto lit = typeParams.begin(), rit = other.typeParams.begin(); lit != typeParams.end();
         lit++, rit++) {
        const Type* l = *lit;
        const Type* r = *rit;
        if (l && r) {
            if (!l->isMatching(*r))
                return false;
        }
        else {
            if (l != r)
                return false;
        }
    }

    return true;
}